

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse2::
     BVHNIntersector1<4,_16777232,_true,_embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar19;
  int iVar20;
  ulong uVar21;
  Geometry *pGVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  undefined1 (*pauVar27) [16];
  int iVar28;
  undefined4 uVar29;
  undefined1 (*pauVar30) [16];
  int *piVar31;
  AABBNodeMB4D *node1;
  ulong uVar32;
  RTCRayQueryContext *pRVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar62;
  float fVar63;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar64;
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar71;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar88;
  float fVar91;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar89;
  float fVar90;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar87 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar104;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar131 [16];
  float fVar137;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar138 [16];
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1251;
  ulong local_1250;
  Scene *local_1248;
  float fStack_1240;
  float fStack_123c;
  undefined8 local_1238;
  float fStack_1230;
  float fStack_122c;
  RayQueryContext *local_1220;
  float local_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  undefined1 local_1208 [16];
  RayHit *local_11f0;
  long local_11e8;
  int local_11dc;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [8];
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  undefined1 local_11a8 [16];
  undefined8 local_1198;
  float fStack_1190;
  float fStack_118c;
  RTCFilterFunctionNArguments local_1180;
  long local_1150;
  float local_1148;
  float local_1144;
  float local_1140;
  undefined4 local_113c;
  undefined4 local_1138;
  undefined4 local_1134;
  uint local_1130;
  uint local_112c;
  uint local_1128;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  undefined1 local_1108 [12];
  float fStack_10fc;
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 *local_10d8;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  float local_1078 [4];
  float local_1068 [4];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  uint local_fe8;
  uint uStack_fe4;
  uint uStack_fe0;
  uint uStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [8];
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar30 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar71 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar141 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar136 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar128 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar19 = (ray->super_RayK<1>).dir.field_0.field_1;
    fVar52 = 0.0;
    if (0.0 <= fVar128) {
      fVar52 = fVar128;
    }
    fVar128 = (ray->super_RayK<1>).tfar;
    uVar40 = -(uint)(1e-18 <= ABS(aVar19.x));
    uVar41 = -(uint)(1e-18 <= ABS(aVar19.y));
    uVar45 = -(uint)(1e-18 <= ABS(aVar19.z));
    auVar81 = divps(_DAT_01f7ba10,(undefined1  [16])aVar19);
    fVar122 = (float)(~uVar40 & 0x5d5e0b6b | auVar81._0_4_ & uVar40);
    fVar124 = (float)(~uVar41 & 0x5d5e0b6b | auVar81._4_4_ & uVar41);
    fVar126 = (float)(~uVar45 & 0x5d5e0b6b | auVar81._8_4_ & uVar45);
    fVar129 = fVar122 * 0.99999964;
    fVar132 = fVar124 * 0.99999964;
    fVar134 = fVar126 * 0.99999964;
    fVar122 = fVar122 * 1.0000004;
    fVar124 = fVar124 * 1.0000004;
    fVar126 = fVar126 * 1.0000004;
    fVar115 = 0.0;
    if (0.0 <= fVar128) {
      fVar115 = fVar128;
    }
    local_f88._4_4_ = fVar124;
    local_f88._0_4_ = fVar124;
    fStack_f80 = fVar124;
    fStack_f7c = fVar124;
    uVar36 = (ulong)(fVar129 < 0.0) * 0x10;
    uVar37 = (ulong)(fVar132 < 0.0) << 4 | 0x20;
    uVar39 = (ulong)(fVar134 < 0.0) << 4 | 0x40;
    uVar38 = uVar37 ^ 0x10;
    auVar81._4_4_ = fVar115;
    auVar81._0_4_ = fVar115;
    auVar81._8_4_ = fVar115;
    auVar81._12_4_ = fVar115;
    _local_fe8 = mm_lookupmask_ps._240_8_;
    _uStack_fe0 = mm_lookupmask_ps._248_8_;
    local_11b8 = fVar122;
    fStack_11b4 = fVar122;
    fStack_11b0 = fVar122;
    fStack_11ac = fVar122;
    local_ff8 = fVar136;
    fStack_ff4 = fVar136;
    fStack_ff0 = fVar136;
    fStack_fec = fVar136;
    local_1008 = fVar52;
    fStack_1004 = fVar52;
    fStack_1000 = fVar52;
    fStack_ffc = fVar52;
    local_1018 = fVar126;
    fStack_1014 = fVar126;
    fStack_1010 = fVar126;
    fStack_100c = fVar126;
    local_1028 = fVar134;
    fStack_1024 = fVar134;
    fStack_1020 = fVar134;
    fStack_101c = fVar134;
    local_1038 = fVar71;
    fStack_1034 = fVar71;
    fStack_1030 = fVar71;
    fStack_102c = fVar71;
    local_1048 = fVar141;
    fStack_1044 = fVar141;
    fStack_1040 = fVar141;
    fStack_103c = fVar141;
    local_1118 = fVar129;
    fStack_1114 = fVar129;
    fStack_1110 = fVar129;
    fStack_110c = fVar129;
    local_1058 = fVar132;
    fStack_1054 = fVar132;
    fStack_1050 = fVar132;
    fStack_104c = fVar132;
    local_1248 = (Scene *)ray;
    fVar115 = fVar122;
    fVar124 = fVar122;
    fVar146 = fVar122;
    fVar62 = fVar129;
    fVar63 = fVar129;
    fVar64 = fVar129;
    local_11f0 = ray;
    local_1220 = context;
    local_1250 = uVar37;
    fVar113 = fVar71;
    fVar112 = fVar71;
    fVar111 = fVar71;
    fVar110 = fVar134;
    fVar109 = fVar134;
    fVar108 = fVar134;
    fVar107 = fVar126;
    fVar106 = fVar126;
    fVar104 = fVar126;
    fVar96 = fVar132;
    fVar95 = fVar132;
    fVar94 = fVar132;
    fVar93 = fVar141;
    fVar92 = fVar141;
    fVar91 = fVar141;
    fVar90 = fVar52;
    fVar89 = fVar52;
    fVar88 = fVar52;
    fVar80 = fVar136;
    fVar79 = fVar136;
    fVar78 = fVar136;
LAB_00d08efa:
    do {
      pauVar27 = pauVar30 + -1;
      pauVar30 = pauVar30 + -1;
      if (*(float *)((long)*pauVar27 + 8) <= fVar128) {
        uVar34 = *(ulong *)*pauVar30;
        while ((uVar34 & 8) == 0) {
          fVar114 = (ray->super_RayK<1>).dir.field_0.m128[3];
          fVar128 = (ray->super_RayK<1>).tfar;
          uVar32 = uVar34 & 0xfffffffffffffff0;
          pfVar8 = (float *)(uVar32 + 0x80 + uVar36);
          pfVar1 = (float *)(uVar32 + 0x20 + uVar36);
          auVar82._0_4_ = ((*pfVar8 * fVar114 + *pfVar1) - fVar111) * fVar129;
          auVar82._4_4_ = ((pfVar8[1] * fVar114 + pfVar1[1]) - fVar112) * fVar62;
          auVar82._8_4_ = ((pfVar8[2] * fVar114 + pfVar1[2]) - fVar113) * fVar63;
          auVar82._12_4_ = ((pfVar8[3] * fVar114 + pfVar1[3]) - fVar71) * fVar64;
          auVar72._4_4_ = fVar89;
          auVar72._0_4_ = fVar88;
          auVar72._8_4_ = fVar90;
          auVar72._12_4_ = fVar52;
          auVar72 = maxps(auVar72,auVar82);
          pfVar8 = (float *)(uVar32 + 0x80 + uVar37);
          pfVar1 = (float *)(uVar32 + 0x20 + uVar37);
          auVar74._0_4_ = ((*pfVar8 * fVar114 + *pfVar1) - fVar91) * fVar94;
          auVar74._4_4_ = ((pfVar8[1] * fVar114 + pfVar1[1]) - fVar92) * fVar95;
          auVar74._8_4_ = ((pfVar8[2] * fVar114 + pfVar1[2]) - fVar93) * fVar96;
          auVar74._12_4_ = ((pfVar8[3] * fVar114 + pfVar1[3]) - fVar141) * fVar132;
          pfVar8 = (float *)(uVar32 + 0x80 + uVar39);
          pfVar1 = (float *)(uVar32 + 0x20 + uVar39);
          auVar98._0_4_ = ((*pfVar8 * fVar114 + *pfVar1) - fVar78) * fVar108;
          auVar98._4_4_ = ((pfVar8[1] * fVar114 + pfVar1[1]) - fVar79) * fVar109;
          auVar98._8_4_ = ((pfVar8[2] * fVar114 + pfVar1[2]) - fVar80) * fVar110;
          auVar98._12_4_ = ((pfVar8[3] * fVar114 + pfVar1[3]) - fVar136) * fVar134;
          auVar82 = maxps(auVar74,auVar98);
          _local_1108 = maxps(auVar72,auVar82);
          pfVar8 = (float *)(uVar32 + 0x80 + (uVar36 ^ 0x10));
          pfVar1 = (float *)(uVar32 + 0x20 + (uVar36 ^ 0x10));
          auVar101._0_4_ = ((*pfVar8 * fVar114 + *pfVar1) - fVar111) * fVar122;
          auVar101._4_4_ = ((pfVar8[1] * fVar114 + pfVar1[1]) - fVar112) * fVar115;
          auVar101._8_4_ = ((pfVar8[2] * fVar114 + pfVar1[2]) - fVar113) * fVar124;
          auVar101._12_4_ = ((pfVar8[3] * fVar114 + pfVar1[3]) - fVar71) * fVar146;
          pfVar8 = (float *)(uVar32 + 0x80 + uVar38);
          pfVar1 = (float *)(uVar32 + 0x20 + uVar38);
          auVar99._0_4_ = ((*pfVar8 * fVar114 + *pfVar1) - fVar91) * (float)local_f88._0_4_;
          auVar99._4_4_ = ((pfVar8[1] * fVar114 + pfVar1[1]) - fVar92) * (float)local_f88._4_4_;
          auVar99._8_4_ = ((pfVar8[2] * fVar114 + pfVar1[2]) - fVar93) * fStack_f80;
          auVar99._12_4_ = ((pfVar8[3] * fVar114 + pfVar1[3]) - fVar141) * fStack_f7c;
          pfVar8 = (float *)(uVar32 + 0x80 + (uVar39 ^ 0x10));
          pfVar1 = (float *)(uVar32 + 0x20 + (uVar39 ^ 0x10));
          auVar86._0_4_ = ((*pfVar8 * fVar114 + *pfVar1) - fVar78) * fVar104;
          auVar86._4_4_ = ((pfVar8[1] * fVar114 + pfVar1[1]) - fVar79) * fVar106;
          auVar86._8_4_ = ((pfVar8[2] * fVar114 + pfVar1[2]) - fVar80) * fVar107;
          auVar86._12_4_ = ((pfVar8[3] * fVar114 + pfVar1[3]) - fVar136) * fVar126;
          auVar82 = minps(auVar99,auVar86);
          auVar72 = minps(auVar81,auVar101);
          auVar72 = minps(auVar72,auVar82);
          if (((uint)uVar34 & 7) == 6) {
            bVar23 = (fVar114 < *(float *)(uVar32 + 0xf0) && *(float *)(uVar32 + 0xe0) <= fVar114)
                     && local_1108._0_4_ <= auVar72._0_4_;
            bVar24 = (fVar114 < *(float *)(uVar32 + 0xf4) && *(float *)(uVar32 + 0xe4) <= fVar114)
                     && local_1108._4_4_ <= auVar72._4_4_;
            bVar25 = (fVar114 < *(float *)(uVar32 + 0xf8) && *(float *)(uVar32 + 0xe8) <= fVar114)
                     && local_1108._8_4_ <= auVar72._8_4_;
            bVar26 = (fVar114 < *(float *)(uVar32 + 0xfc) && *(float *)(uVar32 + 0xec) <= fVar114)
                     && local_1108._12_4_ <= auVar72._12_4_;
          }
          else {
            bVar23 = local_1108._0_4_ <= auVar72._0_4_;
            bVar24 = local_1108._4_4_ <= auVar72._4_4_;
            bVar25 = local_1108._8_4_ <= auVar72._8_4_;
            bVar26 = local_1108._12_4_ <= auVar72._12_4_;
          }
          auVar65._0_4_ = (uint)bVar23 * -0x80000000;
          auVar65._4_4_ = (uint)bVar24 * -0x80000000;
          auVar65._8_4_ = (uint)bVar25 * -0x80000000;
          auVar65._12_4_ = (uint)bVar26 * -0x80000000;
          uVar40 = movmskps((int)local_1248,auVar65);
          local_1248 = (Scene *)(ulong)uVar40;
          if (uVar40 == 0) {
            if (pauVar30 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d08efa;
          }
          local_1248 = (Scene *)(ulong)(byte)uVar40;
          lVar35 = 0;
          if (local_1248 != (Scene *)0x0) {
            for (; ((byte)uVar40 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
            }
          }
          uVar34 = *(ulong *)(uVar32 + lVar35 * 8);
          uVar40 = (uVar40 & 0xff) - 1 & uVar40 & 0xff;
          if (uVar40 != 0) {
            uVar41 = *(uint *)(local_1108 + lVar35 * 4);
            local_1248 = (Scene *)(ulong)uVar41;
            lVar35 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
              }
            }
            uVar21 = *(ulong *)(uVar32 + lVar35 * 8);
            uVar45 = *(uint *)(local_1108 + lVar35 * 4);
            uVar40 = uVar40 - 1 & uVar40;
            uVar37 = local_1250;
            if (uVar40 == 0) {
              if (uVar41 < uVar45) {
                *(ulong *)*pauVar30 = uVar21;
                *(uint *)((long)*pauVar30 + 8) = uVar45;
                pauVar30 = pauVar30 + 1;
              }
              else {
                *(ulong *)*pauVar30 = uVar34;
                *(uint *)((long)*pauVar30 + 8) = uVar41;
                pauVar30 = pauVar30 + 1;
                uVar34 = uVar21;
              }
            }
            else {
              auVar58._8_4_ = uVar41;
              auVar58._0_8_ = uVar34;
              auVar58._12_4_ = 0;
              auVar66._8_4_ = uVar45;
              auVar66._0_8_ = uVar21;
              auVar66._12_4_ = 0;
              lVar35 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                }
              }
              uVar34 = *(ulong *)(uVar32 + lVar35 * 8);
              iVar28 = *(int *)(local_1108 + lVar35 * 4);
              auVar73._8_4_ = iVar28;
              auVar73._0_8_ = uVar34;
              auVar73._12_4_ = 0;
              auVar83._8_4_ = -(uint)((int)uVar41 < (int)uVar45);
              uVar40 = uVar40 - 1 & uVar40;
              if (uVar40 == 0) {
                auVar83._4_4_ = auVar83._8_4_;
                auVar83._0_4_ = auVar83._8_4_;
                auVar83._12_4_ = auVar83._8_4_;
                auVar72 = auVar58 & auVar83 | ~auVar83 & auVar66;
                auVar82 = auVar66 & auVar83 | ~auVar83 & auVar58;
                auVar84._8_4_ = -(uint)(auVar72._8_4_ < iVar28);
                auVar84._0_8_ = CONCAT44(auVar84._8_4_,auVar84._8_4_);
                auVar84._12_4_ = auVar84._8_4_;
                auVar74 = auVar73 & auVar84 | ~auVar84 & auVar72;
                auVar59._8_4_ = -(uint)(auVar82._8_4_ < auVar74._8_4_);
                auVar59._4_4_ = auVar59._8_4_;
                auVar59._0_4_ = auVar59._8_4_;
                auVar59._12_4_ = auVar59._8_4_;
                *pauVar30 = ~auVar59 & auVar82 | auVar74 & auVar59;
                pauVar30[1] = auVar82 & auVar59 | ~auVar59 & auVar74;
                pauVar30 = pauVar30 + 2;
                uVar34 = ~auVar84._0_8_ & uVar34 | auVar72._0_8_ & auVar84._0_8_;
                local_1248 = (Scene *)(ulong)uVar40;
              }
              else {
                local_1248 = (Scene *)0x0;
                if ((Scene *)(ulong)uVar40 != (Scene *)0x0) {
                  for (; (uVar40 >> (long)local_1248 & 1) == 0;
                      local_1248 = (Scene *)((long)&(local_1248->super_AccelN).super_Accel.
                                                    super_AccelData.super_RefCount._vptr_RefCount +
                                            1)) {
                  }
                }
                iVar20 = *(int *)(local_1108 + (long)local_1248 * 4);
                auVar97._8_4_ = iVar20;
                auVar97._0_8_ = *(undefined8 *)(uVar32 + (long)local_1248 * 8);
                auVar97._12_4_ = 0;
                auVar85._4_4_ = auVar83._8_4_;
                auVar85._0_4_ = auVar83._8_4_;
                auVar85._8_4_ = auVar83._8_4_;
                auVar85._12_4_ = auVar83._8_4_;
                auVar72 = auVar58 & auVar85 | ~auVar85 & auVar66;
                auVar82 = auVar66 & auVar85 | ~auVar85 & auVar58;
                auVar100._0_4_ = -(uint)(iVar28 < iVar20);
                auVar100._4_4_ = -(uint)(iVar28 < iVar20);
                auVar100._8_4_ = -(uint)(iVar28 < iVar20);
                auVar100._12_4_ = -(uint)(iVar28 < iVar20);
                auVar86 = auVar73 & auVar100 | ~auVar100 & auVar97;
                auVar101 = ~auVar100 & auVar73 | auVar97 & auVar100;
                auVar75._8_4_ = -(uint)(auVar82._8_4_ < auVar101._8_4_);
                auVar75._4_4_ = auVar75._8_4_;
                auVar75._0_4_ = auVar75._8_4_;
                auVar75._12_4_ = auVar75._8_4_;
                auVar98 = auVar82 & auVar75 | ~auVar75 & auVar101;
                auVar67._8_4_ = -(uint)(auVar72._8_4_ < auVar86._8_4_);
                auVar67._0_8_ = CONCAT44(auVar67._8_4_,auVar67._8_4_);
                auVar67._12_4_ = auVar67._8_4_;
                auVar74 = ~auVar67 & auVar72 | auVar86 & auVar67;
                auVar60._8_4_ = -(uint)(auVar74._8_4_ < auVar98._8_4_);
                auVar60._4_4_ = auVar60._8_4_;
                auVar60._0_4_ = auVar60._8_4_;
                auVar60._12_4_ = auVar60._8_4_;
                *pauVar30 = ~auVar75 & auVar82 | auVar101 & auVar75;
                pauVar30[1] = ~auVar60 & auVar74 | auVar98 & auVar60;
                pauVar30[2] = auVar74 & auVar60 | ~auVar60 & auVar98;
                pauVar30 = pauVar30 + 3;
                uVar34 = auVar72._0_8_ & auVar67._0_8_ | ~auVar67._0_8_ & auVar86._0_8_;
                fVar122 = local_11b8;
                fVar115 = fStack_11b4;
                fVar124 = fStack_11b0;
                fVar146 = fStack_11ac;
                fVar129 = local_1118;
                fVar62 = fStack_1114;
                fVar63 = fStack_1110;
                fVar64 = fStack_110c;
              }
            }
          }
        }
        local_1150 = (ulong)((uint)uVar34 & 0xf) - 8;
        if (local_1150 != 0) {
          uVar34 = uVar34 & 0xfffffffffffffff0;
          local_11e8 = 0;
          do {
            lVar35 = local_11e8 * 0x140;
            fVar71 = (ray->super_RayK<1>).dir.field_0.m128[3];
            pfVar9 = (float *)(uVar34 + 0x90 + lVar35);
            pfVar1 = (float *)(uVar34 + lVar35);
            pfVar10 = (float *)(uVar34 + 0xa0 + lVar35);
            pfVar8 = (float *)(uVar34 + 0x10 + lVar35);
            pfVar11 = (float *)(uVar34 + 0xb0 + lVar35);
            pfVar2 = (float *)(uVar34 + 0x20 + lVar35);
            pfVar12 = (float *)(uVar34 + 0xc0 + lVar35);
            pfVar3 = (float *)(uVar34 + 0x30 + lVar35);
            pfVar13 = (float *)(uVar34 + 0xd0 + lVar35);
            pfVar4 = (float *)(uVar34 + 0x40 + lVar35);
            pfVar14 = (float *)(uVar34 + 0xe0 + lVar35);
            pfVar5 = (float *)(uVar34 + 0x50 + lVar35);
            pfVar15 = (float *)(uVar34 + 0xf0 + lVar35);
            pfVar6 = (float *)(uVar34 + 0x60 + lVar35);
            pfVar16 = (float *)(uVar34 + 0x100 + lVar35);
            pfVar7 = (float *)(uVar34 + 0x70 + lVar35);
            pfVar17 = (float *)(uVar34 + 0x110 + lVar35);
            pfVar18 = (float *)(uVar34 + 0x80 + lVar35);
            fVar141 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar136 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar128 = (ray->super_RayK<1>).org.field_0.m128[2];
            local_11c8._0_4_ = (*pfVar9 * fVar71 + *pfVar1) - fVar141;
            local_11c8._4_4_ = (pfVar9[1] * fVar71 + pfVar1[1]) - fVar141;
            fStack_11c0 = (pfVar9[2] * fVar71 + pfVar1[2]) - fVar141;
            fStack_11bc = (pfVar9[3] * fVar71 + pfVar1[3]) - fVar141;
            local_11d8 = (*pfVar10 * fVar71 + *pfVar8) - fVar136;
            fStack_11d4 = (pfVar10[1] * fVar71 + pfVar8[1]) - fVar136;
            fStack_11d0 = (pfVar10[2] * fVar71 + pfVar8[2]) - fVar136;
            fStack_11cc = (pfVar10[3] * fVar71 + pfVar8[3]) - fVar136;
            fVar111 = (*pfVar11 * fVar71 + *pfVar2) - fVar128;
            fVar113 = (pfVar11[1] * fVar71 + pfVar2[1]) - fVar128;
            fStack_1190 = (pfVar11[2] * fVar71 + pfVar2[2]) - fVar128;
            fStack_118c = (pfVar11[3] * fVar71 + pfVar2[3]) - fVar128;
            fVar78 = (*pfVar12 * fVar71 + *pfVar3) - fVar141;
            fVar88 = (pfVar12[1] * fVar71 + pfVar3[1]) - fVar141;
            fVar91 = (pfVar12[2] * fVar71 + pfVar3[2]) - fVar141;
            fVar94 = (pfVar12[3] * fVar71 + pfVar3[3]) - fVar141;
            fVar142 = (*pfVar13 * fVar71 + *pfVar4) - fVar136;
            fVar143 = (pfVar13[1] * fVar71 + pfVar4[1]) - fVar136;
            fVar144 = (pfVar13[2] * fVar71 + pfVar4[2]) - fVar136;
            fVar145 = (pfVar13[3] * fVar71 + pfVar4[3]) - fVar136;
            fVar104 = (*pfVar14 * fVar71 + *pfVar5) - fVar128;
            fVar106 = (pfVar14[1] * fVar71 + pfVar5[1]) - fVar128;
            fVar107 = (pfVar14[2] * fVar71 + pfVar5[2]) - fVar128;
            fVar108 = (pfVar14[3] * fVar71 + pfVar5[3]) - fVar128;
            fVar137 = (*pfVar15 * fVar71 + *pfVar6) - fVar141;
            fVar139 = (pfVar15[1] * fVar71 + pfVar6[1]) - fVar141;
            fVar140 = (pfVar15[2] * fVar71 + pfVar6[2]) - fVar141;
            fVar141 = (pfVar15[3] * fVar71 + pfVar6[3]) - fVar141;
            fVar130 = (*pfVar16 * fVar71 + *pfVar7) - fVar136;
            fVar133 = (pfVar16[1] * fVar71 + pfVar7[1]) - fVar136;
            fVar135 = (pfVar16[2] * fVar71 + pfVar7[2]) - fVar136;
            fVar136 = (pfVar16[3] * fVar71 + pfVar7[3]) - fVar136;
            fVar123 = (fVar71 * *pfVar17 + *pfVar18) - fVar128;
            fVar125 = (fVar71 * pfVar17[1] + pfVar18[1]) - fVar128;
            fVar127 = (fVar71 * pfVar17[2] + pfVar18[2]) - fVar128;
            fVar128 = (fVar71 * pfVar17[3] + pfVar18[3]) - fVar128;
            fVar79 = fVar137 - (float)local_11c8._0_4_;
            fVar89 = fVar139 - (float)local_11c8._4_4_;
            fVar92 = fVar140 - fStack_11c0;
            fVar95 = fVar141 - fStack_11bc;
            local_fa8 = fVar130 - local_11d8;
            fStack_fa4 = fVar133 - fStack_11d4;
            fStack_fa0 = fVar135 - fStack_11d0;
            fStack_f9c = fVar136 - fStack_11cc;
            local_f98 = fVar123 - fVar111;
            fStack_f94 = fVar125 - fVar113;
            fStack_f90 = fVar127 - fStack_1190;
            fStack_f8c = fVar128 - fStack_118c;
            fVar71 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fStack_1230 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_1240 = (ray->super_RayK<1>).dir.field_0.m128[2];
            fVar109 = (local_fa8 * (fVar123 + fVar111) - local_f98 * (fVar130 + local_11d8)) *
                      fVar71 + (local_f98 * (fVar137 + (float)local_11c8._0_4_) -
                               (fVar123 + fVar111) * fVar79) * fStack_1230 +
                               ((fVar130 + local_11d8) * fVar79 -
                               (fVar137 + (float)local_11c8._0_4_) * local_fa8) * fStack_1240;
            fVar110 = (fStack_fa4 * (fVar125 + fVar113) - fStack_f94 * (fVar133 + fStack_11d4)) *
                      fVar71 + (fStack_f94 * (fVar139 + (float)local_11c8._4_4_) -
                               (fVar125 + fVar113) * fVar89) * fStack_1230 +
                               ((fVar133 + fStack_11d4) * fVar89 -
                               (fVar139 + (float)local_11c8._4_4_) * fStack_fa4) * fStack_1240;
            local_fc8._0_8_ = CONCAT44(fVar110,fVar109);
            local_fc8._8_4_ =
                 (fStack_fa0 * (fVar127 + fStack_1190) - fStack_f90 * (fVar135 + fStack_11d0)) *
                 fVar71 + (fStack_f90 * (fVar140 + fStack_11c0) - (fVar127 + fStack_1190) * fVar92)
                          * fStack_1230 +
                          ((fVar135 + fStack_11d0) * fVar92 - (fVar140 + fStack_11c0) * fStack_fa0)
                          * fStack_1240;
            local_fc8._12_4_ =
                 (fStack_f9c * (fVar128 + fStack_118c) - fStack_f8c * (fVar136 + fStack_11cc)) *
                 fVar71 + (fStack_f8c * (fVar141 + fStack_11bc) - (fVar128 + fStack_118c) * fVar95)
                          * fStack_1230 +
                          ((fVar136 + fStack_11cc) * fVar95 - (fVar141 + fStack_11bc) * fStack_f9c)
                          * fStack_1240;
            fVar80 = local_11d8 - fVar142;
            fVar90 = fStack_11d4 - fVar143;
            fVar93 = fStack_11d0 - fVar144;
            fVar96 = fStack_11cc - fVar145;
            local_fb8 = fVar111 - fVar104;
            fStack_fb4 = fVar113 - fVar106;
            fStack_fb0 = fStack_1190 - fVar107;
            fStack_fac = fStack_118c - fVar108;
            local_1198 = (RTCIntersectArguments *)CONCAT44(fVar113,fVar111);
            fVar52 = (float)local_11c8._0_4_ - fVar78;
            fVar129 = (float)local_11c8._4_4_ - fVar88;
            fVar132 = fStack_11c0 - fVar91;
            fVar126 = fStack_11bc - fVar94;
            local_1208._0_4_ =
                 (fVar80 * (fVar111 + fVar104) - local_fb8 * (local_11d8 + fVar142)) * fVar71 +
                 (local_fb8 * ((float)local_11c8._0_4_ + fVar78) - (fVar111 + fVar104) * fVar52) *
                 fStack_1230 +
                 ((local_11d8 + fVar142) * fVar52 - ((float)local_11c8._0_4_ + fVar78) * fVar80) *
                 fStack_1240;
            local_1208._4_4_ =
                 (fVar90 * (fVar113 + fVar106) - fStack_fb4 * (fStack_11d4 + fVar143)) * fVar71 +
                 (fStack_fb4 * ((float)local_11c8._4_4_ + fVar88) - (fVar113 + fVar106) * fVar129) *
                 fStack_1230 +
                 ((fStack_11d4 + fVar143) * fVar129 - ((float)local_11c8._4_4_ + fVar88) * fVar90) *
                 fStack_1240;
            local_1208._8_4_ =
                 (fVar93 * (fStack_1190 + fVar107) - fStack_fb0 * (fStack_11d0 + fVar144)) * fVar71
                 + (fStack_fb0 * (fStack_11c0 + fVar91) - (fStack_1190 + fVar107) * fVar132) *
                   fStack_1230 +
                   ((fStack_11d0 + fVar144) * fVar132 - (fStack_11c0 + fVar91) * fVar93) *
                   fStack_1240;
            local_1208._12_4_ =
                 (fVar96 * (fStack_118c + fVar108) - fStack_fac * (fStack_11cc + fVar145)) * fVar71
                 + (fStack_fac * (fStack_11bc + fVar94) - (fStack_118c + fVar108) * fVar126) *
                   fStack_1230 +
                   ((fStack_11cc + fVar145) * fVar126 - (fStack_11bc + fVar94) * fVar96) *
                   fStack_1240;
            fVar134 = fVar78 - fVar137;
            fVar62 = fVar88 - fVar139;
            fVar63 = fVar91 - fVar140;
            fVar64 = fVar94 - fVar141;
            fVar112 = fVar142 - fVar130;
            fVar114 = fVar143 - fVar133;
            fVar116 = fVar144 - fVar135;
            fVar117 = fVar145 - fVar136;
            fVar118 = fVar104 - fVar123;
            fVar119 = fVar106 - fVar125;
            fVar120 = fVar107 - fVar127;
            fVar121 = fVar108 - fVar128;
            auVar76._0_4_ =
                 (fVar112 * (fVar123 + fVar104) - fVar118 * (fVar130 + fVar142)) * fVar71 +
                 (fVar118 * (fVar137 + fVar78) - (fVar123 + fVar104) * fVar134) * fStack_1230 +
                 ((fVar130 + fVar142) * fVar134 - (fVar137 + fVar78) * fVar112) * fStack_1240;
            auVar76._4_4_ =
                 (fVar114 * (fVar125 + fVar106) - fVar119 * (fVar133 + fVar143)) * fVar71 +
                 (fVar119 * (fVar139 + fVar88) - (fVar125 + fVar106) * fVar62) * fStack_1230 +
                 ((fVar133 + fVar143) * fVar62 - (fVar139 + fVar88) * fVar114) * fStack_1240;
            auVar76._8_4_ =
                 (fVar116 * (fVar127 + fVar107) - fVar120 * (fVar135 + fVar144)) * fVar71 +
                 (fVar120 * (fVar140 + fVar91) - (fVar127 + fVar107) * fVar63) * fStack_1230 +
                 ((fVar135 + fVar144) * fVar63 - (fVar140 + fVar91) * fVar116) * fStack_1240;
            auVar76._12_4_ =
                 (fVar117 * (fVar128 + fVar108) - fVar121 * (fVar136 + fVar145)) * fVar71 +
                 (fVar121 * (fVar141 + fVar94) - (fVar128 + fVar108) * fVar64) * fStack_1230 +
                 ((fVar136 + fVar145) * fVar64 - (fVar141 + fVar94) * fVar117) * fStack_1240;
            local_1218 = fVar109 + local_1208._0_4_ + auVar76._0_4_;
            fStack_1214 = fVar110 + local_1208._4_4_ + auVar76._4_4_;
            fStack_1210 = local_fc8._8_4_ + local_1208._8_4_ + auVar76._8_4_;
            fStack_120c = local_fc8._12_4_ + local_1208._12_4_ + auVar76._12_4_;
            auVar105._8_4_ = local_fc8._8_4_;
            auVar105._0_8_ = local_fc8._0_8_;
            auVar105._12_4_ = local_fc8._12_4_;
            auVar81 = minps(auVar105,local_1208);
            auVar72 = minps(auVar81,auVar76);
            auVar102._8_4_ = local_fc8._8_4_;
            auVar102._0_8_ = local_fc8._0_8_;
            auVar102._12_4_ = local_fc8._12_4_;
            auVar81 = maxps(auVar102,local_1208);
            auVar81 = maxps(auVar81,auVar76);
            local_fd8 = ABS(local_1218);
            fStack_fd4 = ABS(fStack_1214);
            fStack_fd0 = ABS(fStack_1210);
            fStack_fcc = ABS(fStack_120c);
            auVar103._0_4_ =
                 -(uint)(auVar81._0_4_ <= local_fd8 * 1.1920929e-07 ||
                        -(local_fd8 * 1.1920929e-07) <= auVar72._0_4_) & local_fe8;
            auVar103._4_4_ =
                 -(uint)(auVar81._4_4_ <= fStack_fd4 * 1.1920929e-07 ||
                        -(fStack_fd4 * 1.1920929e-07) <= auVar72._4_4_) & uStack_fe4;
            auVar103._8_4_ =
                 -(uint)(auVar81._8_4_ <= fStack_fd0 * 1.1920929e-07 ||
                        -(fStack_fd0 * 1.1920929e-07) <= auVar72._8_4_) & uStack_fe0;
            auVar103._12_4_ =
                 -(uint)(auVar81._12_4_ <= fStack_fcc * 1.1920929e-07 ||
                        -(fStack_fcc * 1.1920929e-07) <= auVar72._12_4_) & uStack_fdc;
            iVar28 = movmskps((int)local_11e8,auVar103);
            if (iVar28 != 0) {
              uVar40 = -(uint)(ABS(local_fb8 * fVar112) <= ABS(local_f98 * fVar80));
              uVar42 = -(uint)(ABS(fStack_fb4 * fVar114) <= ABS(fStack_f94 * fVar90));
              uVar46 = -(uint)(ABS(fStack_fb0 * fVar116) <= ABS(fStack_f90 * fVar93));
              uVar49 = -(uint)(ABS(fStack_fac * fVar117) <= ABS(fStack_f8c * fVar96));
              uVar41 = -(uint)(ABS(fVar52 * fVar118) <= ABS(fVar79 * local_fb8));
              uVar43 = -(uint)(ABS(fVar129 * fVar119) <= ABS(fVar89 * fStack_fb4));
              uVar47 = -(uint)(ABS(fVar132 * fVar120) <= ABS(fVar92 * fStack_fb0));
              uVar50 = -(uint)(ABS(fVar126 * fVar121) <= ABS(fVar95 * fStack_fac));
              uVar45 = -(uint)(ABS(fVar80 * fVar134) <= ABS(local_fa8 * fVar52));
              uVar44 = -(uint)(ABS(fVar90 * fVar62) <= ABS(fStack_fa4 * fVar129));
              uVar48 = -(uint)(ABS(fVar93 * fVar63) <= ABS(fStack_fa0 * fVar132));
              uVar51 = -(uint)(ABS(fVar96 * fVar64) <= ABS(fStack_f9c * fVar126));
              auVar87._0_4_ = (uint)(fVar80 * fVar118 - local_fb8 * fVar112) & uVar40;
              auVar87._4_4_ = (uint)(fVar90 * fVar119 - fStack_fb4 * fVar114) & uVar42;
              auVar87._8_4_ = (uint)(fVar93 * fVar120 - fStack_fb0 * fVar116) & uVar46;
              auVar87._12_4_ = (uint)(fVar96 * fVar121 - fStack_fac * fVar117) & uVar49;
              local_1088._0_4_ = ~uVar40 & (uint)(local_fa8 * local_fb8 - local_f98 * fVar80);
              local_1088._4_4_ = ~uVar42 & (uint)(fStack_fa4 * fStack_fb4 - fStack_f94 * fVar90);
              local_1088._8_4_ = ~uVar46 & (uint)(fStack_fa0 * fStack_fb0 - fStack_f90 * fVar93);
              local_1088._12_4_ = ~uVar49 & (uint)(fStack_f9c * fStack_fac - fStack_f8c * fVar96);
              local_10e8._4_4_ = fStack_1214;
              local_10e8._0_4_ = local_1218;
              local_10e8._8_4_ = fStack_1210;
              local_10e8._12_4_ = fStack_120c;
              local_1088 = local_1088 | auVar87;
              local_1078[0] =
                   (float)(~uVar41 & (uint)(local_f98 * fVar52 - fVar79 * local_fb8) |
                          (uint)(local_fb8 * fVar134 - fVar52 * fVar118) & uVar41);
              local_1078[1] =
                   (float)(~uVar43 & (uint)(fStack_f94 * fVar129 - fVar89 * fStack_fb4) |
                          (uint)(fStack_fb4 * fVar62 - fVar129 * fVar119) & uVar43);
              local_1078[2] =
                   (float)(~uVar47 & (uint)(fStack_f90 * fVar132 - fVar92 * fStack_fb0) |
                          (uint)(fStack_fb0 * fVar63 - fVar132 * fVar120) & uVar47);
              local_1078[3] =
                   (float)(~uVar50 & (uint)(fStack_f8c * fVar126 - fVar95 * fStack_fac) |
                          (uint)(fStack_fac * fVar64 - fVar126 * fVar121) & uVar50);
              local_1068[0] =
                   (float)(~uVar45 & (uint)(fVar79 * fVar80 - local_fa8 * fVar52) |
                          (uint)(fVar52 * fVar112 - fVar80 * fVar134) & uVar45);
              local_1068[1] =
                   (float)(~uVar44 & (uint)(fVar89 * fVar90 - fStack_fa4 * fVar129) |
                          (uint)(fVar129 * fVar114 - fVar90 * fVar62) & uVar44);
              local_1068[2] =
                   (float)(~uVar48 & (uint)(fVar92 * fVar93 - fStack_fa0 * fVar132) |
                          (uint)(fVar132 * fVar116 - fVar93 * fVar63) & uVar48);
              local_1068[3] =
                   (float)(~uVar51 & (uint)(fVar95 * fVar96 - fStack_f9c * fVar126) |
                          (uint)(fVar126 * fVar117 - fVar96 * fVar64) & uVar51);
              fVar141 = fVar71 * local_1088._0_4_ +
                        fStack_1230 * local_1078[0] + fStack_1240 * local_1068[0];
              fVar136 = fVar71 * local_1088._4_4_ +
                        fStack_1230 * local_1078[1] + fStack_1240 * local_1068[1];
              fVar128 = fVar71 * local_1088._8_4_ +
                        fStack_1230 * local_1078[2] + fStack_1240 * local_1068[2];
              fVar71 = fVar71 * local_1088._12_4_ +
                       fStack_1230 * local_1078[3] + fStack_1240 * local_1068[3];
              auVar68._0_4_ = fVar141 + fVar141;
              auVar68._4_4_ = fVar136 + fVar136;
              auVar68._8_4_ = fVar128 + fVar128;
              auVar68._12_4_ = fVar71 + fVar71;
              auVar53._0_4_ = local_11d8 * local_1078[0] + fVar111 * local_1068[0];
              auVar53._4_4_ = fStack_11d4 * local_1078[1] + fVar113 * local_1068[1];
              auVar53._8_4_ = fStack_11d0 * local_1078[2] + fStack_1190 * local_1068[2];
              auVar53._12_4_ = fStack_11cc * local_1078[3] + fStack_118c * local_1068[3];
              fVar52 = (float)local_11c8._0_4_ * local_1088._0_4_ + auVar53._0_4_;
              fVar115 = (float)local_11c8._4_4_ * local_1088._4_4_ + auVar53._4_4_;
              fVar122 = fStack_11c0 * local_1088._8_4_ + auVar53._8_4_;
              fVar129 = fStack_11bc * local_1088._12_4_ + auVar53._12_4_;
              auVar81 = rcpps(auVar53,auVar68);
              fVar71 = auVar81._0_4_;
              fVar141 = auVar81._4_4_;
              fVar136 = auVar81._8_4_;
              fVar128 = auVar81._12_4_;
              local_11c8._0_4_ =
                   ((1.0 - auVar68._0_4_ * fVar71) * fVar71 + fVar71) * (fVar52 + fVar52);
              local_11c8._4_4_ =
                   ((1.0 - auVar68._4_4_ * fVar141) * fVar141 + fVar141) * (fVar115 + fVar115);
              fStack_11c0 = ((1.0 - auVar68._8_4_ * fVar136) * fVar136 + fVar136) *
                            (fVar122 + fVar122);
              fStack_11bc = ((1.0 - auVar68._12_4_ * fVar128) * fVar128 + fVar128) *
                            (fVar129 + fVar129);
              local_11d8 = (ray->super_RayK<1>).tfar;
              fStack_11d4 = (float)(ray->super_RayK<1>).mask;
              fStack_11d0 = (float)(ray->super_RayK<1>).id;
              fStack_11cc = (float)(ray->super_RayK<1>).flags;
              fVar71 = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar54._4_4_ = -(uint)(fVar71 <= (float)local_11c8._4_4_);
              auVar54._0_4_ = -(uint)(fVar71 <= (float)local_11c8._0_4_);
              auVar54._8_4_ = -(uint)(fVar71 <= fStack_11c0);
              auVar54._12_4_ = -(uint)(fVar71 <= fStack_11bc);
              auVar69._0_4_ =
                   (int)((uint)(auVar68._0_4_ != 0.0 &&
                               ((float)local_11c8._0_4_ <= local_11d8 &&
                               fVar71 <= (float)local_11c8._0_4_)) * -0x80000000) >> 0x1f;
              auVar69._4_4_ =
                   (int)((uint)(auVar68._4_4_ != 0.0 &&
                               ((float)local_11c8._4_4_ <= local_11d8 &&
                               fVar71 <= (float)local_11c8._4_4_)) * -0x80000000) >> 0x1f;
              auVar69._8_4_ =
                   (int)((uint)(auVar68._8_4_ != 0.0 &&
                               (fStack_11c0 <= local_11d8 && fVar71 <= fStack_11c0)) * -0x80000000)
                   >> 0x1f;
              auVar69._12_4_ =
                   (int)((uint)(auVar68._12_4_ != 0.0 &&
                               (fStack_11bc <= local_11d8 && fVar71 <= fStack_11bc)) * -0x80000000)
                   >> 0x1f;
              auVar70 = auVar69 & auVar103;
              iVar28 = movmskps(iVar28,auVar70);
              fVar122 = local_11b8;
              fVar115 = fStack_11b4;
              fVar124 = fStack_11b0;
              fVar146 = fStack_11ac;
              if (iVar28 != 0) {
                local_1108._8_4_ = local_fc8._8_4_;
                local_1108._0_8_ = local_fc8._0_8_;
                fStack_10fc = local_fc8._12_4_;
                local_10f8 = local_1208;
                local_10d8 = &local_1251;
                local_10c8 = auVar70;
                local_1098 = _local_11c8;
                local_1248 = local_1220->scene;
                local_11a8 = auVar70;
                auVar81 = rcpps(auVar54,local_10e8);
                fVar71 = auVar81._0_4_;
                fVar141 = auVar81._4_4_;
                fVar136 = auVar81._8_4_;
                fVar128 = auVar81._12_4_;
                fVar71 = (float)(-(uint)(1e-18 <= local_fd8) &
                                (uint)(((float)DAT_01f7ba10 - local_1218 * fVar71) * fVar71 + fVar71
                                      ));
                fVar141 = (float)(-(uint)(1e-18 <= fStack_fd4) &
                                 (uint)((DAT_01f7ba10._4_4_ - fStack_1214 * fVar141) * fVar141 +
                                       fVar141));
                fVar136 = (float)(-(uint)(1e-18 <= fStack_fd0) &
                                 (uint)((DAT_01f7ba10._8_4_ - fStack_1210 * fVar136) * fVar136 +
                                       fVar136));
                fVar128 = (float)(-(uint)(1e-18 <= fStack_fcc) &
                                 (uint)((DAT_01f7ba10._12_4_ - fStack_120c * fVar128) * fVar128 +
                                       fVar128));
                auVar138._0_4_ = fVar109 * fVar71;
                auVar138._4_4_ = fVar110 * fVar141;
                auVar138._8_4_ = local_fc8._8_4_ * fVar136;
                auVar138._12_4_ = local_fc8._12_4_ * fVar128;
                local_10b8 = minps(auVar138,_DAT_01f7ba10);
                auVar131._0_4_ = fVar71 * local_1208._0_4_;
                auVar131._4_4_ = fVar141 * local_1208._4_4_;
                auVar131._8_4_ = fVar136 * local_1208._8_4_;
                auVar131._12_4_ = fVar128 * local_1208._12_4_;
                local_10a8 = minps(auVar131,_DAT_01f7ba10);
                uVar40 = auVar70._0_4_;
                uVar41 = auVar70._4_4_;
                uVar45 = auVar70._8_4_;
                uVar42 = auVar70._12_4_;
                auVar55._0_4_ = uVar40 & local_11c8._0_4_;
                auVar55._4_4_ = uVar41 & local_11c8._4_4_;
                auVar55._8_4_ = uVar45 & (uint)fStack_11c0;
                auVar55._12_4_ = uVar42 & (uint)fStack_11bc;
                auVar61._0_8_ = CONCAT44(~uVar41,~uVar40) & 0x7f8000007f800000;
                auVar61._8_4_ = ~uVar45 & 0x7f800000;
                auVar61._12_4_ = ~uVar42 & 0x7f800000;
                auVar61 = auVar61 | auVar55;
                auVar77._4_4_ = auVar61._0_4_;
                auVar77._0_4_ = auVar61._4_4_;
                auVar77._8_4_ = auVar61._12_4_;
                auVar77._12_4_ = auVar61._8_4_;
                auVar81 = minps(auVar77,auVar61);
                auVar56._0_8_ = auVar81._8_8_;
                auVar56._8_4_ = auVar81._0_4_;
                auVar56._12_4_ = auVar81._4_4_;
                auVar81 = minps(auVar56,auVar81);
                auVar57._0_8_ =
                     CONCAT44(-(uint)(auVar81._4_4_ == auVar61._4_4_) & uVar41,
                              -(uint)(auVar81._0_4_ == auVar61._0_4_) & uVar40);
                auVar57._8_4_ = -(uint)(auVar81._8_4_ == auVar61._8_4_) & uVar45;
                auVar57._12_4_ = -(uint)(auVar81._12_4_ == auVar61._12_4_) & uVar42;
                iVar28 = movmskps((int)local_1220,auVar57);
                if (iVar28 != 0) {
                  auVar70._8_4_ = auVar57._8_4_;
                  auVar70._0_8_ = auVar57._0_8_;
                  auVar70._12_4_ = auVar57._12_4_;
                }
                lVar35 = lVar35 + uVar34;
                uVar29 = movmskps(iVar28,auVar70);
                uVar32 = CONCAT44((int)((ulong)local_1220 >> 0x20),uVar29);
                piVar31 = (int *)0x0;
                local_1238._0_4_ = (uint)fStack_11d4;
                fStack_123c = fStack_1240;
                fStack_122c = fStack_1230;
                local_1238._4_4_ = fStack_1230;
                if (uVar32 != 0) {
                  for (; (uVar32 >> (long)piVar31 & 1) == 0; piVar31 = (int *)((long)piVar31 + 1)) {
                  }
                }
                do {
                  uVar40 = *(uint *)(lVar35 + 0x120 + (long)piVar31 * 4);
                  pGVar22 = (local_1248->geometries).items[uVar40].ptr;
                  if ((pGVar22->mask & (uint)local_1238) == 0) {
                    *(undefined4 *)(local_11a8 + (long)piVar31 * 4) = 0;
                  }
                  else {
                    local_1198 = local_1220->args;
                    if (local_1220->args->filter == (RTCFilterFunctionN)0x0) {
                      pRVar33 = local_1220->user;
                      if (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        fVar71 = *(float *)(local_10b8 + (long)piVar31 * 4);
                        fVar141 = *(float *)(local_10a8 + (long)piVar31 * 4);
                        (ray->super_RayK<1>).tfar = *(float *)(local_1098 + (long)piVar31 * 4);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_1088 + (long)piVar31 * 4);
                        (ray->Ng).field_0.field_0.y = local_1078[(long)piVar31];
                        (ray->Ng).field_0.field_0.z = local_1068[(long)piVar31];
                        ray->u = fVar71;
                        ray->v = fVar141;
                        uVar41 = *(uint *)(lVar35 + 0x130 + (long)piVar31 * 4);
                        local_1248 = (Scene *)(ulong)uVar41;
                        ray->primID = uVar41;
                        ray->geomID = uVar40;
                        ray->instID[0] = pRVar33->instID[0];
                        ray->instPrimID[0] = pRVar33->instPrimID[0];
                        fVar122 = local_11b8;
                        fVar115 = fStack_11b4;
                        fVar124 = fStack_11b0;
                        fVar146 = fStack_11ac;
                        break;
                      }
                    }
                    else {
                      pRVar33 = local_1220->user;
                    }
                    local_1148 = *(float *)(local_1088 + (long)piVar31 * 4);
                    local_1144 = local_1078[(long)piVar31];
                    local_1140 = local_1068[(long)piVar31];
                    local_113c = *(undefined4 *)(local_10b8 + (long)piVar31 * 4);
                    local_1138 = *(undefined4 *)(local_10a8 + (long)piVar31 * 4);
                    local_1134 = *(undefined4 *)(lVar35 + 0x130 + (long)piVar31 * 4);
                    local_1130 = uVar40;
                    local_112c = pRVar33->instID[0];
                    local_1128 = pRVar33->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_1098 + (long)piVar31 * 4);
                    local_11dc = -1;
                    local_1180.valid = &local_11dc;
                    local_1180.geometryUserPtr = pGVar22->userPtr;
                    local_1180.context = pRVar33;
                    local_1180.ray = (RTCRayN *)ray;
                    local_1180.hit = (RTCHitN *)&local_1148;
                    local_1180.N = 1;
                    local_1218 = SUB84(pGVar22,0);
                    fStack_1214 = (float)((ulong)pGVar22 >> 0x20);
                    local_1238 = piVar31;
                    local_1208._0_8_ = lVar35;
                    if (((pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*pGVar22->intersectionFilterN)(&local_1180), uVar37 = local_1250,
                        ray = local_11f0, *local_1180.valid != 0)) &&
                       ((local_1198->filter == (RTCFilterFunctionN)0x0 ||
                        ((((local_1198->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(CONCAT44(fStack_1214,local_1218) + 0x3e) & 0x40) == 0)) ||
                         ((*local_1198->filter)(&local_1180), uVar37 = local_1250, ray = local_11f0,
                         *local_1180.valid != 0)))))) {
                      (((Vec3f *)((long)local_1180.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1180.hit;
                      (((Vec3f *)((long)local_1180.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1180.hit + 4);
                      (((Vec3f *)((long)local_1180.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1180.hit + 8);
                      *(float *)((long)local_1180.ray + 0x3c) = *(float *)(local_1180.hit + 0xc);
                      *(float *)((long)local_1180.ray + 0x40) = *(float *)(local_1180.hit + 0x10);
                      *(float *)((long)local_1180.ray + 0x44) = *(float *)(local_1180.hit + 0x14);
                      *(float *)((long)local_1180.ray + 0x48) = *(float *)(local_1180.hit + 0x18);
                      *(float *)((long)local_1180.ray + 0x4c) = *(float *)(local_1180.hit + 0x1c);
                      *(float *)((long)local_1180.ray + 0x50) = *(float *)(local_1180.hit + 0x20);
                    }
                    else {
                      (local_11f0->super_RayK<1>).tfar = local_11d8;
                      uVar37 = local_1250;
                      ray = local_11f0;
                    }
                    *(undefined4 *)(local_11a8 + (long)local_1238 * 4) = 0;
                    local_11d8 = (ray->super_RayK<1>).tfar;
                    fStack_11d4 = (float)(ray->super_RayK<1>).mask;
                    fStack_11d0 = (float)(ray->super_RayK<1>).id;
                    fStack_11cc = (float)(ray->super_RayK<1>).flags;
                    local_11a8._0_4_ = -(uint)(local_11c8._0_4_ <= local_11d8) & local_11a8._0_4_;
                    local_11a8._4_4_ = -(uint)(local_11c8._4_4_ <= local_11d8) & local_11a8._4_4_;
                    local_11a8._8_4_ = -(uint)(local_11c8._8_4_ <= local_11d8) & local_11a8._8_4_;
                    local_11a8._12_4_ = -(uint)(local_11c8._12_4_ <= local_11d8) & local_11a8._12_4_
                    ;
                    piVar31 = local_1238;
                    lVar35 = local_1208._0_8_;
                    local_1238._0_4_ = (ray->super_RayK<1>).mask;
                  }
                  iVar28 = movmskps((int)piVar31,local_11a8);
                  fVar122 = local_11b8;
                  fVar115 = fStack_11b4;
                  fVar124 = fStack_11b0;
                  fVar146 = fStack_11ac;
                  if (iVar28 == 0) break;
                  local_1208._0_8_ = lVar35;
                  BVHNIntersector1<4,16777232,true,embree::sse2::ArrayIntersector1<embree::sse2::TriangleMvMBIntersector1Pluecker<4,true>>>
                  ::intersect();
                  piVar31 = local_1180.valid;
                  lVar35 = local_1208._0_8_;
                  uVar37 = local_1250;
                  ray = local_11f0;
                } while( true );
              }
            }
            local_11e8 = local_11e8 + 1;
          } while (local_11e8 != local_1150);
        }
        fVar128 = (ray->super_RayK<1>).tfar;
        auVar81._4_4_ = fVar128;
        auVar81._0_4_ = fVar128;
        auVar81._8_4_ = fVar128;
        auVar81._12_4_ = fVar128;
        fVar78 = local_ff8;
        fVar79 = fStack_ff4;
        fVar80 = fStack_ff0;
        fVar136 = fStack_fec;
        fVar88 = local_1008;
        fVar89 = fStack_1004;
        fVar90 = fStack_1000;
        fVar52 = fStack_ffc;
        fVar91 = local_1048;
        fVar92 = fStack_1044;
        fVar93 = fStack_1040;
        fVar141 = fStack_103c;
        fVar129 = local_1118;
        fVar62 = fStack_1114;
        fVar63 = fStack_1110;
        fVar64 = fStack_110c;
        fVar94 = local_1058;
        fVar95 = fStack_1054;
        fVar96 = fStack_1050;
        fVar132 = fStack_104c;
        fVar104 = local_1018;
        fVar106 = fStack_1014;
        fVar107 = fStack_1010;
        fVar126 = fStack_100c;
        fVar108 = local_1028;
        fVar109 = fStack_1024;
        fVar110 = fStack_1020;
        fVar134 = fStack_101c;
        fVar111 = local_1038;
        fVar112 = fStack_1034;
        fVar113 = fStack_1030;
        fVar71 = fStack_102c;
      }
    } while (pauVar30 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }